

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O1

bool __thiscall QHttp2Connection::sendClientPreface(QHttp2Connection *this)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  long in_FS_OFFSET;
  code *local_48;
  undefined8 local_40;
  QMetaMethodReturnArgument local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = (long *)QMetaObject::cast((QObject *)&QIODevice::staticMetaObject);
  lVar3 = QIODevice::write((char *)plVar2,0x269fa0);
  if (lVar3 == 0x18) {
    bVar1 = sendSETTINGS(this);
    if (bVar1) {
      this[0x2b0] = (QHttp2Connection)0x1;
      lVar3 = (**(code **)(*plVar2 + 0xa0))(plVar2);
      bVar1 = true;
      if (lVar3 != 0) {
        local_48 = handleReadyRead;
        local_40 = 0;
        local_38.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
        local_38.name = (char *)0x0;
        local_38.data = (void *)0x0;
        QMetaObject::invokeMethodCallableHelper<void(QHttp2Connection::*)()>
                  ((ContextType *)this,(offset_in_QHttp2Connection_to_subr *)&local_48,
                   QueuedConnection,&local_38);
      }
      goto LAB_001eb29e;
    }
    qHttp2ConnectionLog();
    if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
        != 0) {
      sendClientPreface(this);
    }
  }
  bVar1 = false;
LAB_001eb29e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2Connection::sendClientPreface()
{
    QIODevice *socket = getSocket();
    // 3.5 HTTP/2 Connection Preface
    const qint64 written = socket->write(Http2clientPreface, clientPrefaceLength);
    if (written != clientPrefaceLength)
        return false;

    if (!sendSETTINGS()) {
        qCWarning(qHttp2ConnectionLog, "[%p] Failed to send SETTINGS", this);
        return false;
    }
    m_prefaceSent = true;
    if (socket->bytesAvailable()) // We ignore incoming data until preface is sent, so handle it now
        QMetaObject::invokeMethod(this, &QHttp2Connection::handleReadyRead, Qt::QueuedConnection);
    return true;
}